

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

void __thiscall llvm::Triple::setTriple(Triple *this,Twine *Str)

{
  Triple local_48;
  
  Triple(&local_48,Str);
  std::__cxx11::string::operator=((string *)this,(string *)&local_48);
  this->Environment = local_48.Environment;
  this->ObjectFormat = local_48.ObjectFormat;
  this->Arch = local_48.Arch;
  this->SubArch = local_48.SubArch;
  this->Vendor = local_48.Vendor;
  this->OS = local_48.OS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.Data._M_dataplus._M_p != &local_48.Data.field_2) {
    operator_delete(local_48.Data._M_dataplus._M_p,local_48.Data.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Triple::setTriple(const Twine &Str) {
  *this = Triple(Str);
}